

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O2

void fix_reloc_addends(GlobalVars *gv,LinkedSection *ls)

{
  Reloc *r;
  
  r = (Reloc *)&ls->relocs;
  while (r = (Reloc *)(r->n).next, (r->n).next != (node *)0x0) {
    writesection(gv,ls->data + r->offset,r,r->addend);
  }
  return;
}

Assistant:

static void fix_reloc_addends(struct GlobalVars *gv,struct LinkedSection *ls)
{
  struct Reloc *rel;

  for (rel=(struct Reloc *)ls->relocs.first;
       rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next) {
    writesection(gv,ls->data+rel->offset,rel,rel->addend);
  }
}